

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArraySubImage3D::testCopyTexSubImage3D
          (TextureCubeMapArraySubImage3D *this,GLuint width,GLuint height,GLuint depth,
          SubImage3DCopyParams *copy_params,GLboolean *test_passed)

{
  ostringstream *this_00;
  bool bVar1;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  clearCubeMapArrayTexture(this,width,height,depth,0);
  copyTexSubImage3D(this,copy_params);
  bVar1 = checkResults(this,width,height,depth);
  if (!bVar1) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,
               "glCopyTexSubImage3D failed to copy data to texture cube map array\'s data store\n",
               0x4f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Texture Cube Map Array Dimensions (width, height, depth) ",0x39);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Texture Cube Map Array Offsets (xoffset, yoffset, zoffset) ",0x3b
              );
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Texture Cube Map Array Copy Size (width, height, depth) ",0x38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")\n",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
    *test_passed = '\0';
  }
  return;
}

Assistant:

void TextureCubeMapArraySubImage3D::testCopyTexSubImage3D(glw::GLuint width, glw::GLuint height, glw::GLuint depth,
														  const SubImage3DCopyParams& copy_params,
														  glw::GLboolean&			  test_passed)
{
	clearCubeMapArrayTexture(width, height, depth, 0);

	copyTexSubImage3D(copy_params);

	if (!checkResults(width, height, depth))
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glCopyTexSubImage3D failed to copy data to texture cube map array's data store\n"
						   << "Texture Cube Map Array Dimensions (width, height, depth) "
						   << "(" << width << "," << height << "," << depth << ")\n"
						   << "Texture Cube Map Array Offsets (xoffset, yoffset, zoffset) "
						   << "(" << copy_params.m_xoffset << "," << copy_params.m_yoffset << ","
						   << copy_params.m_zoffset << ")\n"
						   << "Texture Cube Map Array Copy Size (width, height, depth) "
						   << "(" << copy_params.m_width << "," << copy_params.m_height << "," << copy_params.m_depth
						   << ")\n"
						   << tcu::TestLog::EndMessage;

		test_passed = false;
	}
}